

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_reset_destroy_helper
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen,uint *arena_ind,arena_t **arena)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  
  if (((mib != (size_t *)0x0 || miblen != 0) || oldp != (void *)0x0) || oldlenp != (size_t *)0x0) {
    return 1;
  }
  uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
  if (uVar1 >> 0x20 != 0) {
    return 0xe;
  }
  *(int *)newp = (int)uVar1;
  pvVar2 = duckdb_je_arenas[uVar1].repr;
  if (pvVar2 != (void *)0x0) {
    *(void **)newlen = pvVar2;
    iVar3 = 0xe;
    if (duckdb_je_manual_arena_base <= *(uint *)((long)pvVar2 + 0x13468)) {
      iVar3 = 0;
    }
    return iVar3;
  }
  *(undefined8 *)newlen = 0;
  return 0xe;
}

Assistant:

static int
arena_i_reset_destroy_helper(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen, unsigned *arena_ind,
    arena_t **arena) {
	int ret;

	NEITHER_READ_NOR_WRITE();
	MIB_UNSIGNED(*arena_ind, 1);

	*arena = arena_get(tsd_tsdn(tsd), *arena_ind, false);
	if (*arena == NULL || arena_is_auto(*arena)) {
		ret = EFAULT;
		goto label_return;
	}

	ret = 0;
label_return:
	return ret;
}